

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstanceSymbols.cpp
# Opt level: O3

void __thiscall
slang::ast::CheckerMemberVisitor::handle(CheckerMemberVisitor *this,MemberAccessExpression *expr)

{
  Type *this_00;
  CheckerInstanceBodySymbol *pCVar1;
  CheckerInstanceBodySymbol *pCVar2;
  bool bVar3;
  Type *pTVar4;
  Symbol *pSVar5;
  CheckerInstanceBodySymbol *pCVar6;
  Diagnostic *this_01;
  Symbol *pSVar7;
  
  this_00 = (expr->value_->type).ptr;
  bVar3 = Type::isFixedSize(this_00);
  if (bVar3) {
    pTVar4 = this_00->canonical;
    if (pTVar4 == (Type *)0x0) {
      Type::resolveCanonical(this_00);
      pTVar4 = this_00->canonical;
    }
    if ((pTVar4->super_Symbol).kind != ClassType) goto LAB_00241475;
  }
  bVar3 = Expression::bad(&expr->super_Expression);
  if ((!bVar3) &&
     (pSVar5 = Expression::getSymbolReference(expr->value_,true), pSVar5 != (Symbol *)0x0)) {
    pCVar1 = this->body;
    pSVar7 = pSVar5;
    pCVar6 = pCVar1;
    if (pCVar1 != (CheckerInstanceBodySymbol *)0x0) {
      pCVar6 = (CheckerInstanceBodySymbol *)&pCVar1->super_Scope;
    }
    do {
      pCVar2 = (CheckerInstanceBodySymbol *)pSVar7->parentScope;
      if (pCVar2 == (CheckerInstanceBodySymbol *)0x0) break;
      if (pCVar2 == pCVar6) goto LAB_00241475;
      pSVar7 = (Symbol *)(pCVar2->super_Symbol).name._M_len;
    } while (pSVar7->kind != InstanceBody);
    this_01 = Scope::addDiag(&pCVar1->super_Scope,(DiagCode)0x4b0007,
                             (expr->super_Expression).sourceRange);
    Diagnostic::addNote(this_01,(DiagCode)0x50001,pSVar5->location);
    return;
  }
LAB_00241475:
  Expression::visitExpression<slang::ast::Expression_const,slang::ast::CheckerMemberVisitor&>
            (expr->value_,expr->value_,this);
  return;
}

Assistant:

void handle(const MemberAccessExpression& expr) {
        auto& valueType = *expr.value().type;
        if ((!valueType.isFixedSize() || valueType.isClass()) && !expr.bad()) {
            if (auto sym = expr.value().getSymbolReference(); sym && !isFromChecker(*sym)) {
                auto& diag = body.addDiag(diag::DynamicFromChecker, expr.sourceRange);
                diag.addNote(diag::NoteDeclarationHere, sym->location);
                return;
            }
        }
        visitDefault(expr);
    }